

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg.hpp
# Opt level: O2

string_view __thiscall mg::data::MappedMrg::entry_data(MappedMrg *this,int index)

{
  const_reference pvVar1;
  string_view sVar2;
  
  pvVar1 = std::
           vector<mg::data::Mrg::PackedEntryHeader,_std::allocator<mg::data::Mrg::PackedEntryHeader>_>
           ::at(&this->_entries,(long)index);
  sVar2._M_len = (ulong)pvVar1->size_sectors << 0xb;
  sVar2._M_str = ((this->_backing_data).
                  super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_data
                 + (ulong)pvVar1->offset * 0x800;
  return sVar2;
}

Assistant:

const std::string_view entry_data(int index) const {
    const auto &entry = _entries.at(index);
    const size_t offset_bytes = (size_t)entry.offset * (size_t)Mrg::SECTOR_SIZE;
    const unsigned size_bytes = entry.size_sectors * Mrg::SECTOR_SIZE;
    return std::string_view(
        reinterpret_cast<const char *>(_backing_data->data()) + offset_bytes,
        size_bytes);
  }